

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O3

void mk_server_loop_balancer(mk_server *server)

{
  uint uVar1;
  void *pvVar2;
  mk_server_listen *listener;
  int remote_fd;
  int iVar3;
  mk_list *list;
  mk_event_loop *loop;
  undefined8 *puVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  mk_sched_worker *sched;
  mk_sched_conn *data;
  mk_list *__mptr;
  mk_list *pmVar8;
  long lVar9;
  long lVar10;
  uint64_t val;
  mk_event management_event;
  long local_88 [11];
  
  list = mk_server_listen_init(server);
  if (list == (mk_list *)0x0) {
    mk_print(0x1001,"Failed to initialize listen sockets.");
    return;
  }
  loop = mk_event_loop_create(0x100);
  if (loop == (mk_event_loop *)0x0) {
    mk_print(0x1001,"Could not initialize event loop");
    exit(1);
  }
  for (pmVar8 = list->next; pmVar8 != list; pmVar8 = pmVar8->next) {
    mk_event_add(loop,*(int *)&pmVar8[-2].prev,1,1,&pmVar8[-7].next);
  }
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[10] = 0;
  mk_event_add(loop,server->lib_ch_manager[0],0,1,local_88 + 2);
LAB_0010e3da:
  do {
    mk_event_wait(loop);
  } while (loop->n_events < 1);
  pvVar2 = loop->data;
  puVar4 = (undefined8 *)(*(long *)((long)pvVar2 + 8) + 4);
  lVar10 = 1;
  lVar9 = 0x10;
  do {
    listener = (mk_server_listen *)*puVar4;
    uVar1 = (listener->event).mask;
    if ((uVar1 & 1) == 0) {
      if ((uVar1 & 0x2018) != 0) {
        uVar1 = (listener->event).fd;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        mk_print(0x1001,"[server] Error on socket %d: %s",(ulong)uVar1,pcVar6);
      }
    }
    else if (server->lib_ch_manager[0] == (listener->event).fd) {
      sVar7 = read(server->lib_ch_manager[0],local_88,8);
      if (sVar7 == 0) {
        return;
      }
      if (local_88[0] == 0xdddddddd) {
        mk_event_loop_destroy(loop);
        mk_server_listen_exit(list);
        return;
      }
    }
    else {
      sched = mk_sched_next_target(server);
      if (sched == (mk_sched_worker *)0x0) {
        mk_print(0x1002,"[server] Over capacity.");
      }
      else {
        remote_fd = mk_socket_accept(listener->server_fd);
        if (remote_fd != -1) {
          data = mk_sched_add_connection(remote_fd,listener,sched,server);
          if (data != (mk_sched_conn *)0x0) {
            iVar3 = mk_event_add(sched->loop,remote_fd,3,1,data);
            if (iVar3 == 0) {
              sched->accepted_connections = sched->accepted_connections + 1;
              goto LAB_0010e4db;
            }
            mk_server_loop_balancer_cold_1();
          }
          (*listener->network->network->close)(listener->network,remote_fd);
        }
LAB_0010e4db:
        if (0 < sched->signal_channel_w) {
          local_88[1] = 0xeeffaacc;
          write(sched->signal_channel_w,local_88 + 1,8);
        }
      }
    }
    if (loop->n_events <= lVar10) goto LAB_0010e3da;
    puVar4 = (undefined8 *)(lVar9 + *(long *)((long)pvVar2 + 8));
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0xc;
  } while( true );
}

Assistant:

void mk_server_loop_balancer(struct mk_server *server)
{
    size_t bytes;
    uint64_t val;
    int operation_flag;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_server_listen *listener;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_sched_worker *sched;
    struct mk_event management_event;

    /* Init the listeners */
    listeners = mk_server_listen_init(server);
    if (!listeners) {
        mk_err("Failed to initialize listen sockets.");
        return;
    }

    /* Create an event loop context */
    evl = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!evl) {
        mk_err("Could not initialize event loop");
        exit(EXIT_FAILURE);
    }

    /* Register the listeners */
    mk_list_foreach(head, listeners) {
        listener = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_add(evl, listener->server_fd,
                     MK_EVENT_LISTENER, MK_EVENT_READ,
                     listener);
    }

    memset(&management_event, 0, sizeof(struct mk_event));

    mk_event_add(evl,
                 server->lib_ch_manager[0],
                 MK_EVENT_NOTIFICATION,
                 MK_EVENT_READ,
                 &management_event);

    operation_flag = MK_TRUE;
    while (operation_flag) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            if (event->mask & MK_EVENT_READ) {
                /* This signal is sent by mk_stop and both this and
                 * mk_lib_worker are expecting it.
                 */
                if (server->lib_ch_manager[0] == event->fd) {
#ifdef _WIN32
        bytes = recv(event->fd, &val, sizeof(uint64_t), MSG_WAITALL);
#else
        bytes = read(event->fd, &val, sizeof(uint64_t));
#endif

                    if (bytes <= 0) {
                        return;
                    }

                    if (val == MK_SERVER_SIGNAL_STOP) {
                        operation_flag = MK_FALSE;

                        break;
                    }

                    continue;
                }

                /*
                 * Accept connection: determinate which thread may work on this
                 * new connection.
                 */
                sched = mk_sched_next_target(server);
                if (sched != NULL) {
                    mk_server_listen_handler(sched, event, server);

                    mk_server_lib_notify_event_loop_break(sched);

#ifdef MK_HAVE_TRACE
                    int i;
                    struct mk_sched_ctx *ctx = server->sched_ctx;

                    for (i = 0; i < server->workers; i++) {
                        MK_TRACE("Worker Status");
                        MK_TRACE(" WID %i / conx = %llu",
                                 ctx->workers[i].idx,
                                 ctx->workers[i].accepted_connections -
                                 ctx->workers[i].closed_connections);
                    }
#endif
                }
                else {
                    mk_warn("[server] Over capacity.");
                }
            }
            else if (event->mask & MK_EVENT_CLOSE) {
                mk_err("[server] Error on socket %d: %s",
                       event->fd, strerror(errno));
            }
        }
    }
    mk_event_loop_destroy(evl);
    mk_server_listen_exit(listeners);
}